

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O0

void __thiscall Thread::~Thread(Thread *this)

{
  Thread *this_local;
  
  if (((this->started_ & 1U) != 0) && ((this->joined_ & 1U) == 0)) {
    pthread_detach(this->pthreadId_);
  }
  CountDownLatch::~CountDownLatch(&this->latch_);
  std::__cxx11::string::~string((string *)&this->name_);
  std::function<void_()>::~function(&this->func_);
  noncopyable::~noncopyable((noncopyable *)this);
  return;
}

Assistant:

Thread::~Thread() {
    if(started_ && !joined_) pthread_detach(pthreadId_);
}